

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_copy_rect8_16bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  
  if (0 < height) {
    uVar2 = 0;
    do {
      uVar3 = 0;
      if (0 < (int)(width & 0xfffffff8U)) {
        uVar3 = 0;
        pauVar4 = (undefined1 (*) [16])src;
        do {
          auVar1 = vlddqu_avx(*pauVar4);
          *(undefined1 (*) [16])(dst + uVar3) = auVar1;
          uVar3 = uVar3 + 8;
          pauVar4 = pauVar4 + 1;
        } while ((long)uVar3 < (long)(int)(width & 0xfffffff8U));
      }
      if ((int)uVar3 < width) {
        uVar3 = uVar3 & 0xffffffff;
        do {
          dst[uVar3] = *(uint16_t *)(*(undefined1 (*) [16])src + uVar3 * 2);
          uVar3 = uVar3 + 1;
        } while ((uint)width != uVar3);
      }
      uVar2 = uVar2 + 1;
      dst = dst + dstride;
      src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 2);
    } while (uVar2 != (uint)height);
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}